

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O0

void glu::TextureTestUtil::computeQuadTexCoordCube
               (vector<float,_std::allocator<float>_> *dst,CubeFace face)

{
  iterator __result;
  float *pfStack_20;
  int texCoordSize;
  float *texCoord;
  CubeFace face_local;
  vector<float,_std::allocator<float>_> *dst_local;
  
  switch(face) {
  case CUBEFACE_NEGATIVE_X:
    pfStack_20 = computeQuadTexCoordCube::texCoordNegX;
    break;
  case CUBEFACE_POSITIVE_X:
    pfStack_20 = computeQuadTexCoordCube::texCoordPosX;
    break;
  case CUBEFACE_NEGATIVE_Y:
    pfStack_20 = computeQuadTexCoordCube::texCoordNegY;
    break;
  case CUBEFACE_POSITIVE_Y:
    pfStack_20 = computeQuadTexCoordCube::texCoordPosY;
    break;
  case CUBEFACE_NEGATIVE_Z:
    pfStack_20 = computeQuadTexCoordCube::texCoordNegZ;
    break;
  case CUBEFACE_POSITIVE_Z:
    pfStack_20 = computeQuadTexCoordCube::texCoordPosZ;
    break;
  default:
    goto switchD_0103e97d_default;
  }
  std::vector<float,_std::allocator<float>_>::resize(dst,0xc);
  __result = std::vector<float,_std::allocator<float>_>::begin(dst);
  std::
  copy<float_const*,__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>>
            (pfStack_20,pfStack_20 + 0xc,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             __result._M_current);
switchD_0103e97d_default:
  return;
}

Assistant:

void computeQuadTexCoordCube (std::vector<float>& dst, tcu::CubeFace face)
{
	static const float texCoordNegX[] =
	{
		-1.0f,  1.0f, -1.0f,
		-1.0f, -1.0f, -1.0f,
		-1.0f,  1.0f,  1.0f,
		-1.0f, -1.0f,  1.0f
	};
	static const float texCoordPosX[] =
	{
		+1.0f,  1.0f,  1.0f,
		+1.0f, -1.0f,  1.0f,
		+1.0f,  1.0f, -1.0f,
		+1.0f, -1.0f, -1.0f
	};
	static const float texCoordNegY[] =
	{
		-1.0f, -1.0f,  1.0f,
		-1.0f, -1.0f, -1.0f,
		 1.0f, -1.0f,  1.0f,
		 1.0f, -1.0f, -1.0f
	};
	static const float texCoordPosY[] =
	{
		-1.0f, +1.0f, -1.0f,
		-1.0f, +1.0f,  1.0f,
		 1.0f, +1.0f, -1.0f,
		 1.0f, +1.0f,  1.0f
	};
	static const float texCoordNegZ[] =
	{
		 1.0f,  1.0f, -1.0f,
		 1.0f, -1.0f, -1.0f,
		-1.0f,  1.0f, -1.0f,
		-1.0f, -1.0f, -1.0f
	};
	static const float texCoordPosZ[] =
	{
		-1.0f,  1.0f, +1.0f,
		-1.0f, -1.0f, +1.0f,
		 1.0f,  1.0f, +1.0f,
		 1.0f, -1.0f, +1.0f
	};

	const float*	texCoord		= DE_NULL;
	int				texCoordSize	= DE_LENGTH_OF_ARRAY(texCoordNegX);

	switch (face)
	{
		case tcu::CUBEFACE_NEGATIVE_X: texCoord = texCoordNegX; break;
		case tcu::CUBEFACE_POSITIVE_X: texCoord = texCoordPosX; break;
		case tcu::CUBEFACE_NEGATIVE_Y: texCoord = texCoordNegY; break;
		case tcu::CUBEFACE_POSITIVE_Y: texCoord = texCoordPosY; break;
		case tcu::CUBEFACE_NEGATIVE_Z: texCoord = texCoordNegZ; break;
		case tcu::CUBEFACE_POSITIVE_Z: texCoord = texCoordPosZ; break;
		default:
			DE_ASSERT(DE_FALSE);
			return;
	}

	dst.resize(texCoordSize);
	std::copy(texCoord, texCoord+texCoordSize, dst.begin());
}